

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall
ON_NurbsSurface::GetCV(ON_NurbsSurface *this,int i,int j,point_style style,double *Point)

{
  bool bVar1;
  int iVar2;
  double *__src;
  long lVar3;
  double dVar4;
  
  __src = CV(this,i,j);
  if (__src == (double *)0x0) {
LAB_00557ee6:
    bVar1 = false;
  }
  else {
    iVar2 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                      (this);
    lVar3 = (long)iVar2;
    if (this->m_is_rat == 0) {
      dVar4 = 1.0;
    }
    else {
      dVar4 = __src[lVar3];
    }
    if (style == not_rational) {
LAB_00557eda:
      if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_00557ee6;
      for (lVar3 = 0; iVar2 != (int)lVar3; lVar3 = lVar3 + 1) {
        Point[lVar3] = __src[lVar3] * (1.0 / dVar4);
      }
    }
    else {
      if (style != homogeneous_rational) {
        if (style != euclidean_rational) goto LAB_00557ee6;
        Point[lVar3] = dVar4;
        goto LAB_00557eda;
      }
      Point[lVar3] = dVar4;
      memcpy(Point,__src,lVar3 << 3);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool 
ON_NurbsSurface::GetCV( int i, int j, ON::point_style style, double* Point ) const
{
  const double* cv = CV(i,j);
  if ( !cv )
    return false;
  int dim = Dimension();
  double w = ( IsRational() ) ? cv[dim] : 1.0;
  switch(style) {
  case ON::euclidean_rational:
    Point[dim] = w;
    // no break here
  case ON::not_rational:
    if ( w == 0.0 )
      return false;
    w = 1.0/w;
    while(dim--) *Point++ = *cv++ * w;
    break;
  case ON::homogeneous_rational:
    Point[dim] = w;
    memcpy( Point, cv, dim*sizeof(*Point) );
    break;
  default:
    return false;
  }
  return true;
}